

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

int IterativelyApplyExorLink3(char fDistEnable)

{
  int iVar1;
  uint uVar2;
  int local_18;
  int local_14;
  int d;
  int c;
  int z;
  char fDistEnable_local;
  
  s_Dist = DIST3;
  s_fDistEnable2 = (int)fDistEnable & 1;
  s_fDistEnable3 = (int)fDistEnable & 2;
  s_fDistEnable4 = (int)fDistEnable & 4;
  s_cEnquequed = GetQuequeStats(DIST3);
  s_cAttempts = 0;
  s_cReshapes = 0;
  s_nCubesBefore = g_CoverInfo.nCubesInUse;
  d = IteratorCubePairStart(s_Dist,&s_pC1,&s_pC2);
  do {
    if (d == 0) {
      if (g_CoverInfo.Verbosity == 2) {
        printf("ExLink-%d",3);
        printf(": Que= %5d",(ulong)(uint)s_cEnquequed);
        printf("  Att= %4d",(ulong)(uint)s_cAttempts);
        printf("  Resh= %4d",(ulong)(uint)s_cReshapes);
        printf("  NoResh= %4d",(ulong)(uint)(s_cAttempts - s_cReshapes));
        printf("  Cubes= %3d",(ulong)(uint)g_CoverInfo.nCubesInUse);
        printf("  (%d)",(ulong)(uint)(s_nCubesBefore - g_CoverInfo.nCubesInUse));
        uVar2 = CountLiterals();
        printf("  Lits= %5d",(ulong)uVar2);
        uVar2 = CountQCost();
        printf("  QCost = %6d",(ulong)uVar2);
        printf("\n");
      }
      return s_nCubesBefore - g_CoverInfo.nCubesInUse;
    }
    s_cAttempts = s_cAttempts + 1;
    iVar1 = ExorLinkCubeIteratorStart(s_CubeGroup,s_pC1,s_pC2,s_Dist);
    if (iVar1 != 0) {
      CubeExtract(s_pC1);
      CubeExtract(s_pC2);
      MarkSet();
      s_GroupCounter = 0;
      do {
        local_14 = 0;
LAB_003da4c0:
        if (local_14 < 3) {
          if (s_CubeGroup[local_14]->fMark != '\0') goto LAB_003da65c;
          s_Gain = CheckForCloseCubes(s_CubeGroup[local_14],0);
          if (s_Gain == 0) {
            s_CubeGroup[local_14]->fMark = '\x01';
            goto LAB_003da65c;
          }
          if ((s_fDecreaseLiterals != 0) && (s_Gain == 1)) {
            if (g_CoverInfo.fUseQCost == 0) {
              if ((int)s_pC1->a + (int)s_pC2->a + s_ChangeStore.PrevQa <
                  (int)s_CubeGroup[0]->a + (int)s_CubeGroup[1]->a + (int)s_CubeGroup[2]->a)
              goto LAB_003da5c2;
            }
            else if ((int)s_pC1->q + (int)s_pC2->q + s_ChangeStore.PrevQq <
                     (int)s_CubeGroup[0]->q + (int)s_CubeGroup[1]->q + (int)s_CubeGroup[2]->q) {
LAB_003da5c2:
              s_GroupBest = s_GroupCounter;
              UndoRecentChanges();
              goto LAB_003da66c;
            }
          }
          for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
            if (local_18 != local_14) {
              CheckForCloseCubes(s_CubeGroup[local_18],1);
            }
          }
          ExorLinkCubeIteratorCleanUp(1);
          AddToFreeCubes(s_pC1);
          AddToFreeCubes(s_pC2);
          s_cReshapes = s_cReshapes + 1;
          goto LAB_003da6b6;
        }
LAB_003da66c:
        s_GroupCounter = s_GroupCounter + 1;
        MarkRewind();
        iVar1 = ExorLinkCubeIteratorNext(s_CubeGroup);
      } while (iVar1 != 0);
      CubeInsert(s_pC1);
      CubeInsert(s_pC2);
      ExorLinkCubeIteratorCleanUp(0);
    }
LAB_003da6b6:
    d = IteratorCubePairNext();
  } while( true );
LAB_003da65c:
  local_14 = local_14 + 1;
  goto LAB_003da4c0;
}

Assistant:

int IterativelyApplyExorLink3( char fDistEnable )   
{
    int z, c, d;
    // this var is specific to ExorLink-3
    s_Dist = (cubedist)1;

    // enable pair accumulation
    s_fDistEnable2 = fDistEnable & 1;
    s_fDistEnable3 = fDistEnable & 2;
    s_fDistEnable4 = fDistEnable & 4;

    // initialize counters
    s_cEnquequed = GetQuequeStats( s_Dist );
    s_cAttempts  = 0;
    s_cReshapes  = 0;

    // remember the number of cubes before minimization
    s_nCubesBefore = g_CoverInfo.nCubesInUse;

    for ( z = IteratorCubePairStart( s_Dist, &s_pC1, &s_pC2 ); z; z = IteratorCubePairNext() )
    {
        s_cAttempts++;
        // start ExorLink of the given Distance
        if ( ExorLinkCubeIteratorStart( s_CubeGroup, s_pC1, s_pC2, s_Dist ) )
        {
            // extract old cubes from storage (to prevent EXORing with their derivitives)
            CubeExtract( s_pC1 );
            CubeExtract( s_pC2 );

            // mark the current position in the cube pair queques
            MarkSet();

            // check cube groups one by one
            s_GroupCounter = 0;
            do  
            {   // check the cubes of this group one by one
                for ( c = 0; c < 3; c++ )
                if ( !s_CubeGroup[c]->fMark ) // this cube has not yet been checked
                {
                    s_Gain = CheckForCloseCubes( s_CubeGroup[c], 0 ); // do not insert the cube, by default
                    if ( s_Gain ) 
                    { // this cube leads to improvement or reshaping - it is already inserted

                        // decide whether to accept this group based on literal count
                        if ( s_fDecreaseLiterals && s_Gain == 1 )
                        if ( g_CoverInfo.fUseQCost ?
                             s_CubeGroup[0]->q + s_CubeGroup[1]->q + s_CubeGroup[2]->q > s_pC1->q + s_pC2->q + s_ChangeStore.PrevQq :
                             s_CubeGroup[0]->a + s_CubeGroup[1]->a + s_CubeGroup[2]->a > s_pC1->a + s_pC2->a + s_ChangeStore.PrevQa 
                           ) // the group increases literals
                        { // do not take this group
                            // remember the group
                            s_GroupBest = s_GroupCounter;
                            // undo changes to be able to continue checking other groups
                            UndoRecentChanges();
                            break;
                        }

                        // take this group
                        for ( d = 0; d < 3; d++ ) // insert other cubes
                            if ( d != c )
                            {
                                CheckForCloseCubes( s_CubeGroup[d], 1 ); 
//                              if ( s_CubeGroup[d]->fMark )
//                                  CheckAndInsert( s_CubeGroup[d] );
//                                  CheckOnlyOneCube( s_CubeGroup[d] );
//                                  CheckForCloseCubes( s_CubeGroup[d], 1 ); 
//                              else
//                                  CheckForCloseCubes( s_CubeGroup[d], 1 ); 
                            }

                        // clean the results of generating ExorLinked cubes
                        ExorLinkCubeIteratorCleanUp( 1 ); // take the last group
                        // free old cubes
                        AddToFreeCubes( s_pC1 );
                        AddToFreeCubes( s_pC2 );
                        // update the counter
                        s_cReshapes++;
                        goto END_OF_LOOP;
                    }
                    else // mark the cube as checked
                        s_CubeGroup[c]->fMark = 1;
                }
                // the group is not taken - find the new group
                s_GroupCounter++;
                                        
                // rewind to the previously marked position in the cube pair queques
                MarkRewind();
            } 
            while ( ExorLinkCubeIteratorNext( s_CubeGroup ) );
            // none of the groups leads to improvement

            // return the old cubes back to storage
            CubeInsert( s_pC1 );
            CubeInsert( s_pC2 );
            // clean the results of generating ExorLinked cubes
            ExorLinkCubeIteratorCleanUp( 0 );
        }
END_OF_LOOP: {}
    }

    // print the report
    if ( g_CoverInfo.Verbosity == 2 )
    {
    printf( "ExLink-%d", 3 );
    printf( ": Que= %5d", s_cEnquequed );
    printf( "  Att= %4d", s_cAttempts );
    printf( "  Resh= %4d", s_cReshapes );
    printf( "  NoResh= %4d", s_cAttempts - s_cReshapes );
    printf( "  Cubes= %3d", g_CoverInfo.nCubesInUse );
    printf( "  (%d)", s_nCubesBefore - g_CoverInfo.nCubesInUse );
    printf( "  Lits= %5d", CountLiterals() );
    printf( "  QCost = %6d", CountQCost() );
    printf( "\n" );
    }

    // return the number of cubes gained in the process
    return s_nCubesBefore - g_CoverInfo.nCubesInUse;
}